

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

Message * __thiscall google::protobuf::DynamicMessage::New(DynamicMessage *this,Arena *arena)

{
  _Head_base<0UL,_unsigned_int_*,_false> _Var1;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> _Var2;
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var3;
  long in_RSI;
  long in_RDI;
  void *new_base_1;
  void *new_base;
  size_t n;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  LogMessage *in_stack_fffffffffffffea0;
  TypeInfo *in_stack_fffffffffffffea8;
  Arena *in_stack_fffffffffffffeb0;
  TypeInfo *in_stack_fffffffffffffeb8;
  ArenaImpl *in_stack_fffffffffffffec0;
  Message *local_d8;
  Message *local_70;
  _Head_base<0UL,_unsigned_int_*,_false> local_10;
  
  if (in_RSI == 0) {
    local_d8 = (Message *)operator_new((long)**(int **)(in_RDI + 8));
    memset(local_d8,0,(long)**(int **)(in_RDI + 8));
    DynamicMessage((DynamicMessage *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  else {
    _Var1._M_head_impl = (uint *)(long)**(int **)(in_RDI + 8);
    _Var2._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
         (tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
         std::numeric_limits<unsigned_long>::max();
    if ((ulong)_Var2._M_t.
               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
               super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl < _Var1._M_head_impl) {
      internal::LogMessage::LogMessage
                ((LogMessage *)in_stack_fffffffffffffeb0,
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                 (char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      internal::LogMessage::operator<<
                (in_stack_fffffffffffffea0,
                 (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      internal::LogMessage::operator<<
                (in_stack_fffffffffffffea0,
                 (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffea0,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      internal::LogMessage::~LogMessage((LogMessage *)0x557e6a);
    }
    if (in_RSI == 0) {
      local_70 = (Message *)operator_new__((ulong)_Var1._M_head_impl);
    }
    else {
      local_10._M_head_impl = _Var1._M_head_impl;
      _Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
           (_Head_base<0UL,_unsigned_int_*,_false>)std::numeric_limits<unsigned_long>::max();
      if ((ulong)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl <
          _Var1._M_head_impl) {
        in_stack_fffffffffffffeb8 = (TypeInfo *)&stack0xffffffffffffffb8;
        internal::LogMessage::LogMessage
                  ((LogMessage *)in_stack_fffffffffffffeb0,
                   (LogLevel_conflict)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                   (char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        in_stack_fffffffffffffec0 =
             (ArenaImpl *)
             internal::LogMessage::operator<<
                       (in_stack_fffffffffffffea0,
                        (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        in_stack_fffffffffffffeb0 =
             (Arena *)internal::LogMessage::operator<<
                                (in_stack_fffffffffffffea0,
                                 (char *)CONCAT44(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98));
        internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_fffffffffffffea0,
                   (LogMessage *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        internal::LogMessage::~LogMessage((LogMessage *)0x557fae);
      }
      internal::AlignUpTo8((size_t)local_10._M_head_impl);
      Arena::AllocHook(in_stack_fffffffffffffeb0,(type_info *)in_stack_fffffffffffffea8,
                       (size_t)in_stack_fffffffffffffea0);
      local_70 = (Message *)
                 internal::ArenaImpl::AllocateAligned
                           (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
    }
    memset(local_70,0,(long)**(int **)(in_RDI + 8));
    DynamicMessage((DynamicMessage *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffeb0);
    local_d8 = local_70;
  }
  return local_d8;
}

Assistant:

Message* DynamicMessage::New(Arena* arena) const {
  if (arena != NULL) {
    void* new_base = Arena::CreateArray<char>(arena, type_info_->size);
    memset(new_base, 0, type_info_->size);
    return new (new_base) DynamicMessage(type_info_, arena);
  } else {
    void* new_base = operator new(type_info_->size);
    memset(new_base, 0, type_info_->size);
    return new (new_base) DynamicMessage(type_info_);
  }
}